

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

void __thiscall duckdb::SetDefaultInfo::~SetDefaultInfo(SetDefaultInfo *this)

{
  ~SetDefaultInfo(this);
  operator_delete(this);
  return;
}

Assistant:

SetDefaultInfo::~SetDefaultInfo() {
}